

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O0

void __thiscall
AliRoaRequest::AliRoaRequest
          (AliRoaRequest *this,string *version,string *appid,string *secret,string *url)

{
  string local_50;
  string *local_30;
  string *url_local;
  string *secret_local;
  string *appid_local;
  string *version_local;
  AliRoaRequest *this_local;
  
  local_30 = url;
  url_local = secret;
  secret_local = appid;
  appid_local = version;
  version_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)url);
  AliHttpRequest::AliHttpRequest(&this->super_AliHttpRequest,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_AliHttpRequest)._vptr_AliHttpRequest = (_func_int **)&PTR_CommitRequest_00216de0;
  std::__cxx11::string::string((string *)&this->utc_time_);
  std::__cxx11::string::string((string *)&this->sign_nounce);
  std::__cxx11::string::string((string *)&this->version_,(string *)version);
  std::__cxx11::string::string((string *)&this->appid_,(string *)appid);
  std::__cxx11::string::string((string *)&this->secret_,(string *)secret);
  std::__cxx11::string::string((string *)&this->url_,(string *)url);
  return;
}

Assistant:

AliRoaRequest::AliRoaRequest(std::string version, 
                                   std::string appid,
                                   std::string secret,
                                   std::string url)
                                   : AliHttpRequest(url),
                                   version_(version),
                                   appid_(appid),
                                   secret_(secret),
                                   url_(url) {

}